

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDAQuadTestError(IDAMem IDA_mem,sunrealtype ck,sunrealtype *err_k,sunrealtype *err_km1,
                    sunrealtype *err_km2)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int check_for_reduction;
  N_Vector tempv;
  sunrealtype terr_km2;
  sunrealtype terr_km1;
  sunrealtype terr_k;
  sunrealtype errQ_km2;
  sunrealtype errQ_km1;
  sunrealtype errQ_k;
  sunrealtype enormQ;
  double local_90;
  int local_4;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x338);
  dVar4 = (double)N_VWrmsNorm(*(undefined8 *)(in_RDI + 0x348),*(undefined8 *)(in_RDI + 0x340));
  dVar5 = *(double *)(in_RDI + 0x218 + (long)*(int *)(in_RDI + 0x4b8) * 8) * dVar4;
  bVar2 = *in_RSI <= dVar5 && dVar5 != *in_RSI;
  if (bVar2) {
    *in_RSI = dVar5;
  }
  dVar5 = (double)(*(int *)(in_RDI + 0x4b8) + 1) * *in_RSI;
  if (1 < *(int *)(in_RDI + 0x4b8)) {
    N_VLinearSum(0x3ff0000000000000,
                 *(undefined8 *)(in_RDI + 0x300 + (long)*(int *)(in_RDI + 0x4b8) * 8),
                 *(undefined8 *)(in_RDI + 0x348),uVar1);
    dVar7 = *(double *)(in_RDI + 0x218 + (long)(*(int *)(in_RDI + 0x4b8) + -1) * 8);
    dVar6 = (double)N_VWrmsNorm(uVar1,*(undefined8 *)(in_RDI + 0x340));
    dVar7 = dVar7 * dVar6;
    bVar3 = *in_RDX <= dVar7 && dVar7 != *in_RDX;
    if (bVar3) {
      *in_RDX = dVar7;
    }
    dVar7 = (double)*(int *)(in_RDI + 0x4b8) * *in_RDX;
    if (*(int *)(in_RDI + 0x4c0) == *(int *)(in_RDI + 0x4b8) && (bVar3 || bVar2)) {
      if (*(int *)(in_RDI + 0x4b8) < 3) {
        if (dVar7 <= dVar5 * 0.5) {
          *(int *)(in_RDI + 0x4c0) = *(int *)(in_RDI + 0x4b8) + -1;
        }
      }
      else {
        N_VLinearSum(0x3ff0000000000000,
                     *(undefined8 *)(in_RDI + 0x300 + (long)(*(int *)(in_RDI + 0x4b8) + -1) * 8),
                     uVar1,uVar1);
        dVar6 = *(double *)(in_RDI + 0x218 + (long)(*(int *)(in_RDI + 0x4b8) + -2) * 8);
        dVar8 = (double)N_VWrmsNorm(uVar1,*(undefined8 *)(in_RDI + 0x340));
        dVar6 = dVar6 * dVar8;
        if (*in_RCX <= dVar6 && dVar6 != *in_RCX) {
          *in_RCX = dVar6;
        }
        local_90 = (double)(*(int *)(in_RDI + 0x4b8) + -1) * *in_RCX;
        if (local_90 < dVar7) {
          local_90 = dVar7;
        }
        if (local_90 <= dVar5) {
          *(int *)(in_RDI + 0x4c0) = *(int *)(in_RDI + 0x4b8) + -1;
        }
      }
    }
  }
  if (in_XMM0_Qa * dVar4 <= 1.0) {
    local_4 = 0;
  }
  else {
    local_4 = 7;
  }
  return local_4;
}

Assistant:

static int IDAQuadTestError(IDAMem IDA_mem, sunrealtype ck, sunrealtype* err_k,
                            sunrealtype* err_km1, sunrealtype* err_km2)
{
  sunrealtype enormQ;
  sunrealtype errQ_k, errQ_km1, errQ_km2;
  sunrealtype terr_k, terr_km1, terr_km2;
  N_Vector tempv;
  sunbooleantype check_for_reduction = SUNFALSE;

  /* Rename ypQ */
  tempv = IDA_mem->ida_ypQ;

  /* Update error for order k. */
  enormQ = N_VWrmsNorm(IDA_mem->ida_eeQ, IDA_mem->ida_ewtQ);
  errQ_k = IDA_mem->ida_sigma[IDA_mem->ida_kk] * enormQ;
  if (errQ_k > *err_k)
  {
    *err_k              = errQ_k;
    check_for_reduction = SUNTRUE;
  }
  terr_k = (IDA_mem->ida_kk + 1) * (*err_k);

  if (IDA_mem->ida_kk > 1)
  {
    /* Update error at order k-1 */
    N_VLinearSum(ONE, IDA_mem->ida_phiQ[IDA_mem->ida_kk], ONE, IDA_mem->ida_eeQ,
                 tempv);
    errQ_km1 = IDA_mem->ida_sigma[IDA_mem->ida_kk - 1] *
               N_VWrmsNorm(tempv, IDA_mem->ida_ewtQ);
    if (errQ_km1 > *err_km1)
    {
      *err_km1            = errQ_km1;
      check_for_reduction = SUNTRUE;
    }
    terr_km1 = IDA_mem->ida_kk * (*err_km1);

    /* Has an order decrease already been decided in IDATestError? */
    if (IDA_mem->ida_knew != IDA_mem->ida_kk)
    {
      check_for_reduction = SUNFALSE;
    }

    if (check_for_reduction)
    {
      if (IDA_mem->ida_kk > 2)
      {
        /* Update error at order k-2 */
        N_VLinearSum(ONE, IDA_mem->ida_phiQ[IDA_mem->ida_kk - 1], ONE, tempv,
                     tempv);
        errQ_km2 = IDA_mem->ida_sigma[IDA_mem->ida_kk - 2] *
                   N_VWrmsNorm(tempv, IDA_mem->ida_ewtQ);
        if (errQ_km2 > *err_km2) { *err_km2 = errQ_km2; }
        terr_km2 = (IDA_mem->ida_kk - 1) * (*err_km2);

        /* Decrease order if errors are reduced */
        if (SUNMAX(terr_km1, terr_km2) <= terr_k)
        {
          IDA_mem->ida_knew = IDA_mem->ida_kk - 1;
        }
      }
      else
      {
        /* Decrease order to 1 if errors are reduced by at least 1/2 */
        if (terr_km1 <= (HALF * terr_k))
        {
          IDA_mem->ida_knew = IDA_mem->ida_kk - 1;
        }
      }
    }
  }

  /* Perform error test */
  if (ck * enormQ > ONE) { return (ERROR_TEST_FAIL); }
  else { return (IDA_SUCCESS); }
}